

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O3

int __thiscall
vkt::pipeline::multisample::
MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleIgnoresCentroid>::init
          (MSCase<vkt::pipeline::multisample::MSCaseInterpolateAtSampleIgnoresCentroid> *this,
          EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_190 [384];
  
  local_190._0_8_ =
       ((this->super_MultisampleCaseBase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Verifying that interpolateAtSample ignores centroid qualifier.\n",
             0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "\tInterpolate varying containing screen space location with centroid and sample qualifiers.\n"
             ,0x5b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "\t=> interpolateAtSample(screenSample, n) ~= interpolateAtSample(screenCentroid, n)\n"
             ,0x53);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  ctx_00 = (EVP_PKEY_CTX *)&std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  iVar1 = tcu::TestNode::init((TestNode *)this,ctx_00);
  return iVar1;
}

Assistant:

void MSCase<MSCaseInterpolateAtSampleIgnoresCentroid>::init (void)
{
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying that interpolateAtSample ignores centroid qualifier.\n"
		<< "	Interpolate varying containing screen space location with centroid and sample qualifiers.\n"
		<< "	=> interpolateAtSample(screenSample, n) ~= interpolateAtSample(screenCentroid, n)\n"
		<< tcu::TestLog::EndMessage;

	MultisampleCaseBase::init();
}